

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O2

QString * __thiscall
QSqlTableModel::selectStatement(QString *__return_storage_ptr__,QSqlTableModel *this)

{
  long lVar1;
  long lVar2;
  Data *pDVar3;
  QExplicitlySharedDataPointer<QSqlErrorPrivate> QVar4;
  bool bVar5;
  QSqlDriver *pQVar6;
  QArrayDataPointer<char16_t> *this_00;
  QArrayDataPointer<char16_t> *this_01;
  QArrayDataPointer<char16_t> *this_02;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_d8;
  QSqlError local_c0;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  this_00 = &local_d8;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QSqlQueryModel).field_0x8;
  if (*(long *)(lVar2 + 0x2a8) == 0) {
    latin1.m_data = "No table name given";
    latin1.m_size = 0x13;
    QString::QString((QString *)&local_58,latin1);
    this_01 = &local_78;
    local_78.d = (Data *)0x0;
    local_78.ptr = (char16_t *)0x0;
    local_78.size = 0;
    this_02 = &local_98;
    this_00 = &local_b8;
  }
  else {
    lVar1 = lVar2 + 0x298;
    bVar5 = QSqlRecord::isEmpty((QSqlRecord *)(lVar2 + 0x100));
    if (!bVar5) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar6 = QSqlDatabase::driver((QSqlDatabase *)(lVar2 + 0x228));
      (**(code **)(*(long *)pQVar6 + 0xa8))
                (&local_58,pQVar6,1,lVar1,(QSqlRecord *)(lVar2 + 0x100),0);
      if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
        local_98.d = (Data *)0x23;
        local_98.ptr = L"Unable to select fields from table ";
        local_98.size = lVar1;
        QStringBuilder<QLatin1String,_const_QString_&>::convertTo<QString>
                  ((QString *)&local_78,(QStringBuilder<QLatin1String,_const_QString_&> *)&local_98)
        ;
        local_b8.d = (Data *)0x0;
        local_b8.ptr = (char16_t *)0x0;
        local_b8.size = 0;
        local_d8.d = (Data *)0x0;
        local_d8.ptr = (char16_t *)0x0;
        local_d8.size = 0;
        QSqlError::QSqlError
                  (&local_c0,(QString *)&local_78,(QString *)&local_b8,StatementError,
                   (QString *)&local_d8);
        QVar4.d.ptr = (totally_ordered_wrapper<QSqlErrorPrivate_*>)
                      ((totally_ordered_wrapper<QSqlErrorPrivate_*> *)(lVar2 + 0xe0))->ptr;
        ((QExplicitlySharedDataPointer<QSqlErrorPrivate> *)(lVar2 + 0xe0))->d =
             (totally_ordered_wrapper<QSqlErrorPrivate_*>)local_c0.d.d.ptr;
        local_c0.d.d.ptr =
             (QExplicitlySharedDataPointer<QSqlErrorPrivate>)
             (QExplicitlySharedDataPointer<QSqlErrorPrivate>)QVar4.d.ptr;
        QSqlError::~QSqlError(&local_c0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        (__return_storage_ptr__->d).d = local_58.d;
        (__return_storage_ptr__->d).ptr = local_58.ptr;
        (__return_storage_ptr__->d).size = local_58.size;
        if (local_58.d != (Data *)0x0) {
          LOCK();
          ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      else {
        QSqlQueryModelSql::where((QString *)&local_98,(QString *)(lVar2 + 0x2b0));
        QSqlQueryModelSql::concat((QString *)&local_78,(QString *)&local_58,(QString *)&local_98);
        (**(code **)(*(long *)&this->super_QSqlQueryModel + 0x1f0))(&local_b8,this);
        QSqlQueryModelSql::concat(__return_storage_ptr__,(QString *)&local_78,(QString *)&local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      goto LAB_00135eea;
    }
    local_78.d = (Data *)0x15;
    local_78.ptr = L"Unable to find table ";
    local_78.size = lVar1;
    QStringBuilder<QLatin1String,_const_QString_&>::convertTo<QString>
              ((QString *)&local_58,(QStringBuilder<QLatin1String,_const_QString_&> *)&local_78);
    this_01 = &local_98;
    this_02 = &local_b8;
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (char16_t *)0x0;
    local_b8.size = 0;
  }
  local_98.size = 0;
  local_98.ptr = (char16_t *)0x0;
  local_98.d = (Data *)0x0;
  QSqlError::QSqlError
            ((QSqlError *)this_00,(QString *)&local_58,(QString *)this_01,StatementError,
             (QString *)this_02);
  pDVar3 = *(Data **)(lVar2 + 0xe0);
  *(Data **)(lVar2 + 0xe0) = this_00->d;
  this_00->d = pDVar3;
  QSqlError::~QSqlError((QSqlError *)this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_02);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_01);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_00135eea:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSqlTableModel::selectStatement() const
{
    Q_D(const QSqlTableModel);
    if (d->tableName.isEmpty()) {
        d->error = QSqlError("No table name given"_L1, QString(), QSqlError::StatementError);
        return QString();
    }
    if (d->rec.isEmpty()) {
        d->error = QSqlError("Unable to find table "_L1 + d->tableName, QString(),
                             QSqlError::StatementError);
        return QString();
    }

    const QString stmt = d->db.driver()->sqlStatement(QSqlDriver::SelectStatement,
                                                      d->tableName,
                                                      d->rec,
                                                      false);
    if (stmt.isEmpty()) {
        d->error = QSqlError("Unable to select fields from table "_L1 + d->tableName,
                             QString(), QSqlError::StatementError);
        return stmt;
    }
    return SqlTm::concat(SqlTm::concat(stmt, SqlTm::where(d->filter)), orderByClause());
}